

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlElementContentPtr xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt,int inputchk)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlParserErrors code;
  xmlElementContentPtr pxVar3;
  xmlElementContentPtr pxVar4;
  xmlElementContentPtr pxVar5;
  xmlElementContentPtr pxVar6;
  xmlChar *pxVar7;
  xmlParserInputPtr pxVar8;
  
  pxVar8 = ctxt->input;
  if (((pxVar8->flags & 0x40) == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar8 = ctxt->input;
  }
  pxVar7 = pxVar8->cur;
  if (((((*pxVar7 == '#') && (pxVar7[1] == 'P')) && (pxVar7[2] == 'C')) &&
      ((pxVar7[3] == 'D' && (pxVar7[4] == 'A')))) && ((pxVar7[5] == 'T' && (pxVar7[6] == 'A')))) {
    pxVar8->cur = pxVar7 + 7;
    pxVar8->col = pxVar8->col + 7;
    if (pxVar7[7] == '\0') {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    xVar1 = *ctxt->input->cur;
    if ((xVar1 == '(') || (xVar1 == '|')) {
      pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
      pxVar3 = (xmlElementContentPtr)0x0;
      if (pxVar4 != (xmlElementContentPtr)0x0) goto LAB_00138726;
    }
    else if (xVar1 == ')') {
      if (ctxt->input->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
      pxVar3 = (xmlElementContentPtr)0x0;
      if (pxVar4 != (xmlElementContentPtr)0x0) {
        if (*ctxt->input->cur != '*') {
          return pxVar4;
        }
        pxVar4->ocur = XML_ELEMENT_CONTENT_MULT;
        xmlNextChar(ctxt);
        return pxVar4;
      }
    }
    else {
      pxVar4 = (xmlElementContentPtr)0x0;
LAB_00138726:
      pxVar7 = (xmlChar *)0x0;
      pxVar6 = pxVar4;
      while( true ) {
        pxVar2 = ctxt->input->cur;
        xVar1 = *pxVar2;
        pxVar3 = pxVar4;
        if (xVar1 != '|') break;
        if (1 < ctxt->disableSAX) goto LAB_00138887;
        xmlNextChar(ctxt);
        pxVar5 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
        if (pxVar5 == (xmlElementContentPtr)0x0) goto LAB_0013870a;
        if (pxVar7 == (xmlChar *)0x0) {
          pxVar5->c1 = pxVar6;
          pxVar4 = pxVar5;
          if (pxVar6 != (xmlElementContentPtr)0x0) goto LAB_001387a4;
        }
        else {
          pxVar6->c2 = pxVar5;
          pxVar5->parent = pxVar6;
          pxVar6 = xmlNewDocElementContent(ctxt->myDoc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
          pxVar5->c1 = pxVar6;
          if (pxVar6 == (xmlElementContentPtr)0x0) goto LAB_0013870a;
LAB_001387a4:
          pxVar6->parent = pxVar5;
        }
        xmlSkipBlankCharsPE(ctxt);
        pxVar7 = xmlParseName(ctxt);
        if (pxVar7 == (xmlChar *)0x0) {
          xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,
                         "xmlParseElementMixedContentDecl : Name expected\n");
          goto LAB_00138712;
        }
        xmlSkipBlankCharsPE(ctxt);
        pxVar8 = ctxt->input;
        pxVar6 = pxVar5;
        if (((pxVar8->flags & 0x40) == 0) && ((long)pxVar8->end - (long)pxVar8->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
      }
      if ((xVar1 != ')') || (pxVar2[1] != '*')) {
LAB_00138887:
        xmlFreeDocElementContent(ctxt->myDoc,pxVar4);
        code = XML_ERR_MIXED_NOT_STARTED;
        goto LAB_001386d4;
      }
      if (pxVar7 == (xmlChar *)0x0) {
LAB_00138835:
        if (pxVar4 != (xmlElementContentPtr)0x0) {
          pxVar4->ocur = XML_ELEMENT_CONTENT_MULT;
        }
        pxVar8 = ctxt->input;
        if (pxVar8->id != inputchk) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Element content declaration doesn\'t start and stop in the same entity\n")
          ;
          pxVar8 = ctxt->input;
        }
        pxVar7 = pxVar8->cur;
        pxVar8->cur = pxVar7 + 2;
        pxVar8->col = pxVar8->col + 2;
        if (pxVar7[2] != '\0') {
          return pxVar4;
        }
        xmlParserGrow(ctxt);
        return pxVar4;
      }
      pxVar5 = xmlNewDocElementContent(ctxt->myDoc,pxVar7,XML_ELEMENT_CONTENT_ELEMENT);
      pxVar6->c2 = pxVar5;
      if (pxVar5 != (xmlElementContentPtr)0x0) {
        pxVar5->parent = pxVar6;
        goto LAB_00138835;
      }
    }
LAB_0013870a:
    pxVar4 = pxVar3;
    xmlCtxtErrMemory(ctxt);
LAB_00138712:
    xmlFreeDocElementContent(ctxt->myDoc,pxVar4);
  }
  else {
    code = XML_ERR_PCDATA_REQUIRED;
LAB_001386d4:
    xmlFatalErr(ctxt,code,(char *)0x0);
  }
  return (xmlElementContentPtr)0x0;
}

Assistant:

xmlElementContentPtr
xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt, int inputchk) {
    xmlElementContentPtr ret = NULL, cur = NULL, n;
    const xmlChar *elem = NULL;

    GROW;
    if (CMP7(CUR_PTR, '#', 'P', 'C', 'D', 'A', 'T', 'A')) {
	SKIP(7);
	SKIP_BLANKS_PE;
	if (RAW == ')') {
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	    ret = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
                goto mem_error;
	    if (RAW == '*') {
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    }
	    return(ret);
	}
	if ((RAW == '(') || (RAW == '|')) {
	    ret = cur = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
                goto mem_error;
	}
	while ((RAW == '|') && (PARSER_STOPPED(ctxt) == 0)) {
	    NEXT;
            n = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
            if (n == NULL)
                goto mem_error;
	    if (elem == NULL) {
		n->c1 = cur;
		if (cur != NULL)
		    cur->parent = n;
		ret = cur = n;
	    } else {
	        cur->c2 = n;
		n->parent = cur;
		n->c1 = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
                if (n->c1 == NULL)
                    goto mem_error;
		n->c1->parent = n;
		cur = n;
	    }
	    SKIP_BLANKS_PE;
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			"xmlParseElementMixedContentDecl : Name expected\n");
		xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    SKIP_BLANKS_PE;
	    GROW;
	}
	if ((RAW == ')') && (NXT(1) == '*')) {
	    if (elem != NULL) {
		cur->c2 = xmlNewDocElementContent(ctxt->myDoc, elem,
		                               XML_ELEMENT_CONTENT_ELEMENT);
		if (cur->c2 == NULL)
                    goto mem_error;
		cur->c2->parent = cur;
            }
            if (ret != NULL)
                ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    SKIP(2);
	} else {
	    xmlFreeDocElementContent(ctxt->myDoc, ret);
	    xmlFatalErr(ctxt, XML_ERR_MIXED_NOT_STARTED, NULL);
	    return(NULL);
	}

    } else {
	xmlFatalErr(ctxt, XML_ERR_PCDATA_REQUIRED, NULL);
    }
    return(ret);

mem_error:
    xmlErrMemory(ctxt);
    xmlFreeDocElementContent(ctxt->myDoc, ret);
    return(NULL);
}